

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerdisplay.cpp
# Opt level: O1

void __thiscall FListMenuItemPlayerDisplay::UpdateTranslation(FListMenuItemPlayerDisplay *this)

{
  int color;
  uint uVar1;
  long lVar2;
  PClassPlayerPawn *pPVar3;
  undefined8 *puVar4;
  Node *pNVar5;
  int iVar6;
  undefined8 *puVar7;
  Node *pNVar8;
  undefined8 *puVar9;
  FPlayerColorSet *colorset;
  
  lVar2 = (&DAT_00a392c8)[(long)consoleplayer * 0x54];
  uVar1 = (&DAT_00a392d8)[(long)consoleplayer * 0xa8] + 0x1ff;
  puVar4 = (undefined8 *)(lVar2 + (ulong)(uVar1 & 0x1e6) * 0x18);
  do {
    puVar9 = puVar4;
    puVar4 = (undefined8 *)*puVar9;
  } while (*(int *)(puVar9 + 1) != 0x1e6);
  color = *(int *)(puVar9[2] + 0x28);
  puVar4 = (undefined8 *)(lVar2 + (ulong)(uVar1 & 0x1ea) * 0x18);
  do {
    puVar9 = puVar4;
    puVar4 = (undefined8 *)*puVar9;
  } while (*(int *)(puVar9 + 1) != 0x1ea);
  puVar4 = (undefined8 *)
           (lVar2 + (ulong)((&DAT_00a392d8)[(long)consoleplayer * 0xa8] - 1 & 0x219) * 0x18);
  do {
    puVar7 = puVar4;
    puVar4 = (undefined8 *)*puVar7;
  } while (*(int *)(puVar7 + 1) != 0x219);
  if (this->mPlayerClass == (FPlayerClass *)0x0) {
    return;
  }
  uVar1 = *(uint *)(puVar7[2] + 0x28);
  iVar6 = R_FindSkin(skins[*(int *)(puVar9[2] + 0x28)].name,
                     (int)((ulong)((long)this->mPlayerClass - (long)PlayerClasses.Array) >> 5));
  pPVar3 = this->mPlayerClass->Type;
  pNVar5 = (pPVar3->ColorSets).Nodes + ((pPVar3->ColorSets).Size - 1 & uVar1);
  while ((pNVar8 = pNVar5, pNVar8 != (Node *)0x0 && (pNVar8->Next != (Node *)0x1))) {
    pNVar5 = pNVar8->Next;
    if ((pNVar8->Pair).Key == uVar1) {
LAB_0033daf0:
      colorset = &(pNVar8->Pair).Value;
      if (pNVar8 == (Node *)0x0) {
        colorset = (FPlayerColorSet *)0x0;
      }
      R_GetPlayerTranslation
                (color,colorset,skins + iVar6,
                 translationtables[1].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[8].Ptr);
      return;
    }
  }
  pNVar8 = (Node *)0x0;
  goto LAB_0033daf0;
}

Assistant:

void FListMenuItemPlayerDisplay::UpdateTranslation()
{
	int PlayerColor = players[consoleplayer].userinfo.GetColor();
	int	PlayerSkin = players[consoleplayer].userinfo.GetSkin();
	int PlayerColorset = players[consoleplayer].userinfo.GetColorSet();

	if (mPlayerClass != NULL)
	{
		PlayerSkin = R_FindSkin (skins[PlayerSkin].name, int(mPlayerClass - &PlayerClasses[0]));
		R_GetPlayerTranslation(PlayerColor, mPlayerClass->Type->GetColorSet(PlayerColorset),
			&skins[PlayerSkin], translationtables[TRANSLATION_Players][MAXPLAYERS]);
	}
}